

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::CallI
          (ByteCodeWriter *this,OpCode op,RegSlot returnValueRegister,RegSlot functionRegister,
          ArgSlot givenArgCount,ProfileId callSiteId,CallFlags callFlags)

{
  Type TVar1;
  code *pcVar2;
  ArgSlot AVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  RegSlot returnValueRegister_00;
  undefined4 *puVar7;
  uint uVar8;
  Type *data;
  FunctionBody *pFVar9;
  undefined6 in_register_00000082;
  undefined6 in_register_0000008a;
  short sVar10;
  undefined4 uVar11;
  undefined2 local_5e;
  RegSlot local_5c;
  RegSlot local_58;
  CallFlags local_54;
  undefined4 local_50;
  Type local_4a;
  InlineCacheIndex local_48;
  bool local_44;
  ProfileId profileId2;
  CacheIdUnit unit;
  RegSlot local_38;
  ProfileId profileId;
  RegSlot functionRegister_local;
  
  local_50 = (undefined4)CONCAT62(in_register_0000008a,callSiteId);
  unit.cacheId = (uint)CONCAT62(in_register_00000082,givenArgCount);
  local_38 = functionRegister;
  profileId = op;
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)((uint)(callFlags != CallFlags_None) * 3 + 0x1d));
  bVar4 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x4e3,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar4) goto LAB_008903a4;
    *puVar7 = 0;
  }
  if (returnValueRegister == 0xffffffff) {
    returnValueRegister_00 = 0xffffffff;
  }
  else {
    pFVar9 = this->m_functionWrite;
    if (pFVar9 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar4) goto LAB_008903a4;
      *puVar7 = 0;
      pFVar9 = this->m_functionWrite;
    }
    returnValueRegister_00 = FunctionBody::MapRegSlot(pFVar9,returnValueRegister);
  }
  if (functionRegister == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
    if (bVar4) {
      *puVar7 = 0;
      Throw::InternalError();
    }
    goto LAB_008903a4;
  }
  pFVar9 = this->m_functionWrite;
  if (pFVar9 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
    if (!bVar4) goto LAB_008903a4;
    *puVar7 = 0;
    pFVar9 = this->m_functionWrite;
  }
  local_38 = FunctionBody::MapRegSlot(pFVar9,functionRegister);
  uVar11 = local_50;
  sVar10 = (short)local_50;
  local_4a = 0xffff;
  local_48 = 0xffffffff;
  unit._6_2_ = sVar10;
  JsUtil::
  BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::TryGetValueAndRemove
            (this->callRegToLdFldCacheIndexMap,&local_38,(CacheIdUnit *)&stack0xffffffffffffffb8);
  if (3 < (ushort)(profileId - 0x1f)) {
    bVar4 = DoProfileNewScObjArrayOp(this,profileId);
    if (bVar4) {
      bVar4 = DynamicProfileInfo::IsEnabled(NativeArrayPhase,this->m_functionWrite);
      if (bVar4) {
        if (sVar10 != -1) {
LAB_0088ff90:
          TVar1 = this->m_functionWrite->profiledArrayCallSiteCount;
          if (TVar1 != 0xffff) {
            this->m_functionWrite->profiledArrayCallSiteCount = TVar1 + 1;
            local_4a = TVar1;
            OpCodeUtil::ConvertNonCallOpToProfiled(&profileId);
            bVar4 = true;
            uVar11 = (undefined4)CONCAT71((uint7)(uint3)((uint)uVar11 >> 8),1);
            goto LAB_0089021b;
          }
        }
      }
      else {
        bVar4 = DoDynamicProfileOpcode(this,InlinePhase,true);
        if ((sVar10 != -1) && (bVar4)) goto LAB_0088ff90;
      }
    }
    bVar4 = DoProfileNewScObjectOp(this,profileId);
    if (bVar4) {
      bVar4 = DoDynamicProfileOpcode(this,InlinePhase,true);
      if (!bVar4) {
        bVar5 = DynamicProfileInfo::IsEnabled(FixedNewObjPhase,this->m_functionWrite);
        bVar4 = false;
        bVar6 = false;
        if (sVar10 == -1) goto LAB_00890218;
        uVar11 = 0;
        if (!bVar5) goto LAB_0089021b;
LAB_00890022:
        if (local_48 == 0xffffffff) {
          OpCodeUtil::ConvertNonCallOpToProfiled(&profileId);
          goto LAB_00890215;
        }
        OpCodeUtil::ConvertNonCallOpToProfiledWithICIndex(&profileId);
        goto LAB_00890035;
      }
      if (sVar10 != -1) goto LAB_00890022;
    }
    goto LAB_0088fff0;
  }
  bVar4 = DoDynamicProfileOpcode(this,InlinePhase,false);
  if ((sVar10 == -1) || (!bVar4)) {
    bVar4 = DynamicProfileInfo::IsEnabled(AggressiveIntTypeSpecPhase,this->m_functionWrite);
    if ((bVar4) ||
       (bVar4 = DynamicProfileInfo::IsEnabled(FloatTypeSpecPhase,this->m_functionWrite), bVar4)) {
      TVar1 = this->m_functionWrite->profiledReturnTypeCount;
      if (TVar1 == 0xffff) goto LAB_0088fff0;
      this->m_functionWrite->profiledReturnTypeCount = TVar1 + 1;
      unit._6_2_ = TVar1;
      profileId = OpCodeUtil::ConvertCallOpToProfiledReturnType(profileId);
LAB_00890215:
      bVar6 = true;
    }
    else {
LAB_0088fff0:
      bVar6 = false;
    }
LAB_00890218:
    bVar4 = bVar6;
    uVar11 = 0;
  }
  else {
    if (local_48 != 0xffffffff) {
      profileId = OpCodeUtil::ConvertCallOpToProfiled(profileId,true);
LAB_00890035:
      AVar3 = (ArgSlot)unit.cacheId;
      if (callFlags == CallFlags_None) {
        bVar4 = TryWriteCallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                          (this,profileId,returnValueRegister_00,local_38,(ArgSlot)unit.cacheId,
                           local_48,local_44);
        if (((!bVar4) &&
            (bVar4 = TryWriteCallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                               (this,profileId,returnValueRegister_00,local_38,AVar3,local_48,
                                local_44), !bVar4)) &&
           (bVar4 = TryWriteCallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                              (this,profileId,returnValueRegister_00,local_38,AVar3,local_48,
                               local_44), !bVar4)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          uVar8 = 0x52d;
          goto LAB_008901eb;
        }
      }
      else {
        bVar4 = TryWriteCallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                          (this,profileId,returnValueRegister_00,local_38,(ArgSlot)unit.cacheId,
                           local_48,local_44,callFlags);
        if (((!bVar4) &&
            (bVar4 = TryWriteCallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                               (this,profileId,returnValueRegister_00,local_38,AVar3,local_48,
                                local_44,callFlags), !bVar4)) &&
           (bVar4 = TryWriteCallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                              (this,profileId,returnValueRegister_00,local_38,AVar3,local_48,
                               local_44,callFlags), !bVar4)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          uVar8 = 0x529;
LAB_008901eb:
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                      ,uVar8,"(success)","success");
          if (!bVar4) {
LAB_008903a4:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar7 = 0;
        }
      }
      data = (Type *)&unit.field_0x6;
      goto LAB_00890333;
    }
    uVar11 = 0;
    profileId = OpCodeUtil::ConvertCallOpToProfiled(profileId,false);
    bVar4 = true;
  }
LAB_0089021b:
  AVar3 = (ArgSlot)unit.cacheId;
  local_50 = uVar11;
  if (callFlags == CallFlags_None) {
    bVar6 = TryWriteCallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,profileId,returnValueRegister_00,local_38,(ArgSlot)unit.cacheId);
    if ((!bVar6) &&
       (bVar6 = TryWriteCallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                          (this,profileId,returnValueRegister_00,local_38,AVar3), !bVar6)) {
      local_58 = local_38;
      local_5e = (undefined2)unit.cacheId;
      local_5c = returnValueRegister_00;
      Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,profileId,this);
      uVar8 = 10;
      goto LAB_0089030a;
    }
  }
  else {
    bVar6 = TryWriteCallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,profileId,returnValueRegister_00,local_38,(ArgSlot)unit.cacheId,
                       callFlags);
    if ((!bVar6) &&
       (bVar6 = TryWriteCallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                          (this,profileId,returnValueRegister_00,local_38,AVar3,callFlags), !bVar6))
    {
      local_58 = local_38;
      local_5e = (undefined2)unit.cacheId;
      local_54 = callFlags;
      local_5c = returnValueRegister_00;
      Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,profileId,this);
      uVar8 = 0xe;
LAB_0089030a:
      Data::Write(&this->m_byteCodeData,&local_5e,uVar8);
    }
  }
  if (!bVar4) {
    return;
  }
  Data::Write(&this->m_byteCodeData,&unit.field_0x6,2);
  if ((char)local_50 == '\0') {
    return;
  }
  data = &local_4a;
LAB_00890333:
  Data::Write(&this->m_byteCodeData,data,2);
  return;
}

Assistant:

void ByteCodeWriter::CallI(OpCode op, RegSlot returnValueRegister, RegSlot functionRegister, ArgSlot givenArgCount, ProfileId callSiteId, CallFlags callFlags)
    {
        CheckOpen();

        bool hasCallFlags = !(callFlags == CallFlags_None);
        if (hasCallFlags == true)
        {
            CheckOp(op, OpLayoutType::CallIFlags);
        }
        else
        {
            CheckOp(op, OpLayoutType::CallI);
        }

        Assert(OpCodeAttr::HasMultiSizeLayout(op));
        // givenArgCount could be <, ==, or > than Function's "InParams" count

        if (returnValueRegister != Js::Constants::NoRegister)
        {
            returnValueRegister = ConsumeReg(returnValueRegister);
        }
        functionRegister = ConsumeReg(functionRegister);

        bool isProfiled = false;
        bool isProfiled2 = false;
        bool isCallWithICIndex = false;
        ProfileId profileId = callSiteId;
        ProfileId profileId2 = Constants::NoProfileId;

        CacheIdUnit unit;
        unit.cacheId = Js::Constants::NoInlineCacheIndex;
        callRegToLdFldCacheIndexMap->TryGetValueAndRemove(functionRegister, &unit);
        if (DoProfileCallOp(op))
        {
            if (DoDynamicProfileOpcode(InlinePhase) &&
                callSiteId != Js::Constants::NoProfileId)
            {
                if (unit.cacheId == Js::Constants::NoInlineCacheIndex)
                {
                    op = Js::OpCodeUtil::ConvertCallOpToProfiled(op);
                }
                else
                {
                    isCallWithICIndex = true;
                    op = Js::OpCodeUtil::ConvertCallOpToProfiled(op, true);
                }
                isProfiled = true;
            }
            else if ((DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) || DoDynamicProfileOpcode(FloatTypeSpecPhase)) &&
                this->m_functionWrite->AllocProfiledReturnTypeId(&profileId))
            {
                op = Js::OpCodeUtil::ConvertCallOpToProfiledReturnType(op);
                isProfiled = true;
            }
        }
        else if (DoProfileNewScObjArrayOp(op) &&
            (DoDynamicProfileOpcode(NativeArrayPhase, true) || DoDynamicProfileOpcode(InlinePhase, true)) &&
            callSiteId != Js::Constants::NoProfileId &&
            this->m_functionWrite->AllocProfiledArrayCallSiteId(&profileId2))
        {
            OpCodeUtil::ConvertNonCallOpToProfiled(op);
            isProfiled = true;
            isProfiled2 = true;
        }
        else if (DoProfileNewScObjectOp(op) &&
            (DoDynamicProfileOpcode(InlinePhase, true) || DoDynamicProfileOpcode(FixedNewObjPhase, true)) &&
            callSiteId != Js::Constants::NoProfileId)
        {
            if (unit.cacheId == Js::Constants::NoInlineCacheIndex)
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
            }
            else
            {
                isCallWithICIndex = true;
                OpCodeUtil::ConvertNonCallOpToProfiledWithICIndex(op);
            }
            isProfiled = true;
        }

        if (isCallWithICIndex)
        {
            if (hasCallFlags == true)
            {
                MULTISIZE_LAYOUT_WRITE(CallIFlagsWithICIndex, op, returnValueRegister, functionRegister, givenArgCount, unit.cacheId, unit.isRootObjectCache, callFlags);
            }
            else
            {
                MULTISIZE_LAYOUT_WRITE(CallIWithICIndex, op, returnValueRegister, functionRegister, givenArgCount, unit.cacheId, unit.isRootObjectCache);
            }
        }
        else
        {
            if (hasCallFlags == true)
            {
                MULTISIZE_LAYOUT_WRITE(CallIFlags, op, returnValueRegister, functionRegister, givenArgCount, callFlags);
            }
            else
            {
                MULTISIZE_LAYOUT_WRITE(CallI, op, returnValueRegister, functionRegister, givenArgCount);
            }
        }
        if (isProfiled)
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
            if (isProfiled2)
            {
                m_byteCodeData.Encode(&profileId2, sizeof(Js::ProfileId));
            }
        }
    }